

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigWin.c
# Opt level: O1

int Aig_ManFindCut_int(Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited,int nSizeLimit,int nFanoutLimit)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  void **ppvVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  
  uVar1 = vFront->nSize;
  if ((long)(int)uVar1 < 1) {
    uVar8 = 100;
    pvVar10 = (void *)0x0;
  }
  else {
    uVar8 = 100;
    lVar9 = 0;
    pvVar10 = (void *)0x0;
    do {
      pvVar11 = vFront->pArray[lVar9];
      uVar2 = *(ulong *)((long)pvVar11 + 0x18);
      if ((uVar2 & 0x10) == 0) {
        __assert_fail("pNode->fMarkA",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                      ,0x32,"int Aig_NodeGetLeafCostOne(Aig_Obj_t *, int)");
      }
      uVar6 = 999;
      if (((((uint)uVar2 & 7) != 2) &&
          (uVar6 = (uint)((*(byte *)((*(ulong *)((long)pvVar11 + 0x10) & 0xfffffffffffffffe) + 0x18)
                          & 0x10) == 0) +
                   (uint)((*(byte *)((*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffe) + 0x18) &
                          0x10) == 0), 1 < uVar6)) &&
         (nFanoutLimit < (int)((uint)(uVar2 >> 6) & 0x3ffffff))) {
        uVar6 = 999;
      }
      if ((uVar6 < uVar8) ||
         ((uVar8 == uVar6 &&
          ((*(uint *)((long)pvVar10 + 0x1c) & 0xffffff) < ((uint)(uVar2 >> 0x20) & 0xffffff))))) {
        pvVar10 = pvVar11;
        uVar8 = uVar6;
      }
      if (uVar8 == 0) {
        uVar8 = 0;
        break;
      }
      lVar9 = lVar9 + 1;
    } while ((int)uVar1 != lVar9);
  }
  if (pvVar10 == (void *)0x0) {
    return 0;
  }
  if (2 < uVar8) {
    __assert_fail("CostBest < 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                  ,0x67,"int Aig_ManFindCut_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  if (nSizeLimit < (int)(uVar8 + uVar1 + -1)) {
    return 0;
  }
  if ((*(uint *)((long)pvVar10 + 0x18) & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pFaninBest)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                  ,0x6a,"int Aig_ManFindCut_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  lVar9 = (ulong)uVar1 + 1;
  do {
    if ((int)lVar9 + -1 < 1) {
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
    }
    lVar5 = lVar9 + -1;
    lVar3 = lVar9 + -2;
    lVar9 = lVar5;
  } while (vFront->pArray[lVar3] != pvVar10);
  for (; (int)lVar5 < (int)uVar1; lVar5 = lVar5 + 1) {
    vFront->pArray[lVar5 + -1] = vFront->pArray[lVar5];
  }
  vFront->nSize = uVar1 - 1;
  pvVar11 = (void *)(*(ulong *)((long)pvVar10 + 8) & 0xfffffffffffffffe);
  if ((*(ulong *)((long)pvVar11 + 0x18) & 0x10) == 0) {
    *(ulong *)((long)pvVar11 + 0x18) = *(ulong *)((long)pvVar11 + 0x18) | 0x10;
    uVar1 = vFront->nCap;
    if (vFront->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (vFront->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(vFront->pArray,0x80);
        }
        iVar7 = 0x10;
      }
      else {
        iVar7 = uVar1 * 2;
        if (iVar7 <= (int)uVar1) goto LAB_00647499;
        if (vFront->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(vFront->pArray,(ulong)uVar1 << 4);
        }
      }
      vFront->pArray = ppvVar4;
      vFront->nCap = iVar7;
    }
LAB_00647499:
    iVar7 = vFront->nSize;
    vFront->nSize = iVar7 + 1;
    vFront->pArray[iVar7] = pvVar11;
    uVar1 = vVisited->nCap;
    if (vVisited->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar4;
        iVar7 = 0x10;
      }
      else {
        iVar7 = uVar1 * 2;
        if (iVar7 <= (int)uVar1) goto LAB_00647527;
        if (vVisited->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
        }
        vVisited->pArray = ppvVar4;
      }
      vVisited->nCap = iVar7;
    }
LAB_00647527:
    iVar7 = vVisited->nSize;
    vVisited->nSize = iVar7 + 1;
    vVisited->pArray[iVar7] = pvVar11;
  }
  pvVar10 = (void *)(*(ulong *)((long)pvVar10 + 0x10) & 0xfffffffffffffffe);
  if ((*(ulong *)((long)pvVar10 + 0x18) & 0x10) != 0) goto LAB_00647665;
  *(ulong *)((long)pvVar10 + 0x18) = *(ulong *)((long)pvVar10 + 0x18) | 0x10;
  uVar1 = vFront->nCap;
  if (vFront->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vFront->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vFront->pArray,0x80);
      }
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar1 * 2;
      if (iVar7 <= (int)uVar1) goto LAB_006475be;
      if (vFront->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vFront->pArray,(ulong)uVar1 << 4);
      }
    }
    vFront->pArray = ppvVar4;
    vFront->nCap = iVar7;
  }
LAB_006475be:
  iVar7 = vFront->nSize;
  vFront->nSize = iVar7 + 1;
  vFront->pArray[iVar7] = pvVar10;
  uVar1 = vVisited->nCap;
  if (vVisited->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vVisited->pArray,0x80);
      }
      vVisited->pArray = ppvVar4;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar1 * 2;
      if (iVar7 <= (int)uVar1) goto LAB_00647653;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
      }
      vVisited->pArray = ppvVar4;
    }
    vVisited->nCap = iVar7;
  }
LAB_00647653:
  iVar7 = vVisited->nSize;
  vVisited->nSize = iVar7 + 1;
  vVisited->pArray[iVar7] = pvVar10;
LAB_00647665:
  if (vFront->nSize <= nSizeLimit) {
    return 1;
  }
  __assert_fail("Vec_PtrSize(vFront) <= nSizeLimit",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                ,0x81,"int Aig_ManFindCut_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
}

Assistant:

int Aig_ManFindCut_int( Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited, int nSizeLimit, int nFanoutLimit )
{
    Aig_Obj_t * pNode, * pFaninBest, * pNext;
    int CostBest, CostCur, i;
    // find the best fanin
    CostBest   = 100;
    pFaninBest = NULL;
//printf( "Evaluating fanins of the cut:\n" );
    Vec_PtrForEachEntry( Aig_Obj_t *, vFront, pNode, i )
    {
        CostCur = Aig_NodeGetLeafCostOne( pNode, nFanoutLimit );
//printf( "    Fanin %s has cost %d.\n", Aig_ObjName(pNode), CostCur );
        if ( CostBest > CostCur ||
            (CostBest == CostCur && pNode->Level > pFaninBest->Level) )
        {
            CostBest   = CostCur;
            pFaninBest = pNode;
        }
        if ( CostBest == 0 )
            break;
    }
    if ( pFaninBest == NULL )
        return 0;
    assert( CostBest < 3 );
    if ( Vec_PtrSize(vFront) - 1 + CostBest > nSizeLimit )
        return 0;
    assert( Aig_ObjIsNode(pFaninBest) );
    // remove the node from the array
    Vec_PtrRemove( vFront, pFaninBest );
//printf( "Removing fanin %s.\n", Aig_ObjName(pFaninBest) );

    // add the left child to the fanins
    pNext = Aig_ObjFanin0(pFaninBest);
    if ( !pNext->fMarkA )
    {
//printf( "Adding fanin %s.\n", Aig_ObjName(pNext) );
        pNext->fMarkA = 1;
        Vec_PtrPush( vFront, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    // add the right child to the fanins
    pNext = Aig_ObjFanin1(pFaninBest);
    if ( !pNext->fMarkA )
    {
//printf( "Adding fanin %s.\n", Aig_ObjName(pNext) );
        pNext->fMarkA = 1;
        Vec_PtrPush( vFront, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    assert( Vec_PtrSize(vFront) <= nSizeLimit );
    // keep doing this
    return 1;
}